

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_4fPoint * __thiscall ON_4fPoint::operator+=(ON_4fPoint *this,ON_4fPoint *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = p->w;
  fVar4 = this->w;
  if (((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) || ((fVar3 == 0.0 && (!NAN(fVar3))))) {
    this->x = p->x + this->x;
    this->y = p->y + this->y;
    this->z = p->z + this->z;
  }
  else if ((fVar4 != 0.0) || (NAN(fVar4))) {
    if (fVar4 <= 0.0) {
      if (-0.0 < fVar4) {
        fVar4 = sqrtf(-fVar4);
      }
      else {
        fVar4 = SQRT(-fVar4);
      }
      fVar4 = -fVar4;
    }
    else if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar3 = p->w;
    if (fVar3 <= 0.0) {
      if (-0.0 < fVar3) {
        fVar3 = sqrtf(-fVar3);
      }
      else {
        fVar3 = SQRT(-fVar3);
      }
      fVar3 = -fVar3;
    }
    else if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar2 = fVar3 / fVar4;
    fVar1 = fVar4 / fVar3;
    this->x = this->x * fVar2 + p->x * fVar1;
    this->y = this->y * fVar2 + p->y * fVar1;
    this->z = this->z * fVar2 + p->z * fVar1;
    this->w = fVar4 * fVar3;
  }
  else {
    this->x = p->x + this->x;
    this->y = p->y + this->y;
    this->z = p->z + this->z;
    this->w = fVar3;
  }
  return this;
}

Assistant:

ON_4fPoint& ON_4fPoint::operator+=(const ON_4fPoint& p)
{
  // sum w = sqrt(w1*w2)
  if ( p.w == w ) {
    x += p.x;
    y += p.y;
    z += p.z;
  }
  else if (p.w == 0.0 ) {
    x += p.x;
    y += p.y;
    z += p.z;
  }
  else if ( w == 0.0 ) {
    x += p.x;
    y += p.y;
    z += p.z;
    w = p.w;
  }
  else {
    const double sw1 = (w>0.0) ? sqrt(w) : -sqrt(-w);
    const double sw2 = (p.w>0.0) ? sqrt(p.w) : -sqrt(-p.w);
    const double s1 = sw2/sw1;
    const double s2 = sw1/sw2;
    x = (float)(x*s1 + p.x*s2);
    y = (float)(y*s1 + p.y*s2);
    z = (float)(z*s1 + p.z*s2);
    w = (float)(sw1*sw2);
  }
  return *this;
}